

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O0

int GetStartupMessageRPLIDAR(RPLIDAR *pRPLIDAR)

{
  int iVar1;
  RPLIDAR *pRPLIDAR_local;
  
  mSleep(100);
  iVar1 = PurgeRS232Port(&pRPLIDAR->RS232Port);
  if (iVar1 == 0) {
    iVar1 = PurgeRS232Port(&pRPLIDAR->RS232Port);
    if (iVar1 == 0) {
      pRPLIDAR_local._4_4_ = 0;
    }
    else {
      printf("Error purging data from a RPLIDAR. \n");
      pRPLIDAR_local._4_4_ = 1;
    }
  }
  else {
    printf("Error purging data from a RPLIDAR. \n");
    pRPLIDAR_local._4_4_ = 1;
  }
  return pRPLIDAR_local._4_4_;
}

Assistant:

inline int GetStartupMessageRPLIDAR(RPLIDAR* pRPLIDAR)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
	mSleep(100);
#ifdef FORCE_RPLIDAR_SDK_V1
	if (IS_FAIL(pRPLIDAR->drv->clearNetSerialRxCache()))
	{
		printf("A RPLIDAR is not responding correctly : clearNetSerialRxCache() failed. \n");
		return EXIT_FAILURE;
	}
#else
	pRPLIDAR->channel->flush();
#endif // FORCE_RPLIDAR_SDK_V1
#else
	//unsigned char databuf[57]; // A2...
	//unsigned char databuf[MAX_NB_BYTES_RPLIDAR];
	//int nbReadBytes = 0;

	//// Undocumented response for A2...
	//memset(databuf, 0, sizeof(databuf));
	//if (ReadAllRS232Port(&pRPLIDAR->RS232Port, databuf, sizeof(databuf)) != EXIT_SUCCESS)
	//{ 
	//	printf("A RPLIDAR is not responding correctly. \n");
	//	return EXIT_FAILURE;	
	//}

	// Undocumented response...
	mSleep(100);

	//memset(databuf, 0, sizeof(databuf));
	//if (ReadRS232Port(&pRPLIDAR->RS232Port, databuf, sizeof(databuf), &nbReadBytes) != EXIT_SUCCESS)
	//{ 
	//	//printf("Warning : A RPLIDAR might not be responding correctly. \n");
	//	//return EXIT_FAILURE;	
	//}

	if (PurgeRS232Port(&pRPLIDAR->RS232Port) != EXIT_SUCCESS)
	{
		printf("Error purging data from a RPLIDAR. \n");
		return EXIT_FAILURE;
	}
	// Need to purge twice on Mac OS otherwise next read() would fail...?
	if (PurgeRS232Port(&pRPLIDAR->RS232Port) != EXIT_SUCCESS)
	{
		printf("Error purging data from a RPLIDAR. \n");
		return EXIT_FAILURE;
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}